

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_top_predictor_8x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar15;
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar9 [16];
  ushort uVar19;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar14;
  byte bVar16;
  
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)above;
  auVar9 = psadbw((undefined1  [16])0x0,auVar7);
  uVar8 = auVar9._0_2_ + 4;
  uVar15 = auVar9._2_2_ + 4;
  uVar17 = auVar9._4_2_ + 4;
  uVar18 = auVar9._6_2_ + 4;
  auVar10._0_2_ = uVar8 >> 3;
  uVar19 = uVar18 >> 3;
  uVar1 = CONCAT22((ushort)(auVar9._8_2_ + 4U) >> 3,uVar19);
  auVar11._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar9._10_2_ + 4U) >> 3,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar12._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar9._12_2_ + 4U) >> 3,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar13._0_13_ = auVar5 << 0x30;
  bVar16 = (byte)(uVar18 >> 8);
  auVar13._14_2_ = (undefined2)(CONCAT19(bVar16 >> 3,CONCAT18(bVar16 >> 3,uVar3)) >> 0x40);
  auVar13[0xd] = (char)uVar19;
  bVar16 = (byte)(uVar17 >> 0xb);
  auVar12._12_4_ = (undefined4)(CONCAT37(auVar13._13_3_,CONCAT16((char)uVar19,uVar2)) >> 0x30);
  auVar12[0xb] = bVar16;
  uVar14 = (undefined1)(uVar17 >> 3);
  auVar11._10_6_ = (undefined6)(CONCAT55(auVar12._11_5_,CONCAT14(bVar16,uVar1)) >> 0x20);
  auVar11[9] = uVar14;
  bVar16 = (byte)(uVar15 >> 0xb);
  auVar10._8_8_ = (undefined8)(CONCAT73(auVar11._9_7_,CONCAT12(uVar14,uVar19)) >> 0x10);
  auVar10[7] = bVar16;
  auVar10[6] = bVar16;
  uVar14 = (undefined1)(uVar15 >> 3);
  auVar10[5] = uVar14;
  auVar10[4] = uVar14;
  bVar16 = (byte)(uVar8 >> 8);
  auVar10[3] = bVar16 >> 3;
  auVar10[2] = bVar16 >> 3;
  auVar9[0] = (undefined1)auVar10._0_2_;
  auVar9._2_14_ = auVar10._2_14_;
  auVar9[1] = auVar9[0];
  auVar7 = pshuflw(auVar7,auVar9,0);
  iVar6 = 0x20;
  do {
    *(long *)dst = auVar7._0_8_;
    dst = dst + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void aom_dc_top_predictor_8x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  (void)left;
  __m128i sum_above = dc_sum_8(above);
  const __m128i four = _mm_set1_epi16(4);
  sum_above = _mm_add_epi16(sum_above, four);
  sum_above = _mm_srai_epi16(sum_above, 3);
  sum_above = _mm_unpacklo_epi8(sum_above, sum_above);
  const __m128i row = _mm_shufflelo_epi16(sum_above, 0);
  dc_store_8xh(&row, 32, dst, stride);
}